

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall Renderer::setPreviewNote(Renderer *this,int note)

{
  QMutex *pQVar1;
  QMutex *pQVar2;
  PreviewState PVar3;
  bool bVar4;
  int iVar5;
  DefaultApu *this_00;
  
  bVar4 = AudioStream::isEnabled(&this->mStream);
  if (bVar4) {
    pQVar1 = &(this->mContext).mMutex;
    pQVar2 = &(this->mContext).mMutex;
    LOCK();
    bVar4 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar4) {
      QBasicMutex::lockInternal();
    }
    PVar3 = (this->mContext).mHandle.previewState;
    if (PVar3 == waveform) {
      iVar5 = trackerboy::lookupToneNote(note);
      this_00 = &(this->mContext).mHandle.apu;
      trackerboy::DefaultApu::writeRegister(this_00,'\x1d',(uint8_t)iVar5);
      trackerboy::DefaultApu::writeRegister(this_00,'\x1e',(uint8_t)((uint)iVar5 >> 8));
    }
    else if (PVar3 == instrument) {
      trackerboy::InstrumentPreview::play(&(this->mContext).mHandle.ip,(uint8_t)note);
    }
    LOCK();
    bVar4 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar4) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar4) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void Renderer::setPreviewNote(int note) {
    if (mStream.isEnabled()) {
        auto ctx = mContext.access();
        switch (ctx->previewState) {
            case PreviewState::waveform: {
                auto freq = trackerboy::lookupToneNote(note);
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR33, (uint8_t)(freq & 0xFF));
                ctx->apu.writeRegister(trackerboy::Apu::REG_NR34, (uint8_t)(freq >> 8));
                break;
            }
            case PreviewState::instrument:
                // update the current note
                ctx->ip.play((uint8_t)note);
                break;
            default:
                break;
        
        }
    }
}